

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86compiler.cpp
# Opt level: O1

Error __thiscall asmjit::x86::Compiler::finalize(Compiler *this)

{
  Error EVar1;
  Assembler a;
  Assembler AStack_88;
  
  EVar1 = BaseBuilder::runPasses((BaseBuilder *)this);
  if (EVar1 == 0) {
    Assembler::Assembler
              (&AStack_88,(this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._code);
    AStack_88.super_BaseAssembler.super_BaseEmitter._encodingOptions =
         AStack_88.super_BaseAssembler.super_BaseEmitter._encodingOptions |
         (this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter._encodingOptions;
    BaseEmitter::addValidationOptions
              ((BaseEmitter *)&AStack_88,
               (uint)(this->super_BaseCompiler).super_BaseBuilder.super_BaseEmitter.
                     _validationOptions);
    EVar1 = BaseBuilder::serializeTo((BaseBuilder *)this,(BaseEmitter *)&AStack_88);
    Assembler::~Assembler(&AStack_88);
  }
  return EVar1;
}

Assistant:

Error Compiler::finalize() {
  ASMJIT_PROPAGATE(runPasses());
  Assembler a(_code);
  a.addEncodingOptions(encodingOptions());
  a.addValidationOptions(validationOptions());
  return serializeTo(&a);
}